

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogt_vox.h
# Opt level: O0

uint32_t compute_looped_frame_index
                   (uint32_t first_loop_frame,uint32_t last_loop_frame,uint32_t frame_index)

{
  bool bVar1;
  uint uVar2;
  uint32_t frames_since_first_frame_1;
  uint32_t frames_since_first_frame;
  uint32_t looped_frame_index;
  uint32_t loop_len;
  uint32_t frame_index_local;
  uint32_t last_loop_frame_local;
  uint32_t first_loop_frame_local;
  
  uVar2 = (last_loop_frame + 1) - first_loop_frame;
  if (frame_index < first_loop_frame) {
    frames_since_first_frame_1 = last_loop_frame - ((first_loop_frame - frame_index) - 1) % uVar2;
  }
  else {
    frames_since_first_frame_1 = first_loop_frame + (frame_index - first_loop_frame) % uVar2;
  }
  bVar1 = false;
  if ((first_loop_frame <= frames_since_first_frame_1) &&
     (bVar1 = false, frames_since_first_frame_1 <= last_loop_frame)) {
    bVar1 = true;
  }
  if (!bVar1) {
    __assert_fail("(looped_frame_index >= first_loop_frame && looped_frame_index <= last_loop_frame) && (\"bug in looping logic!\")"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/jpaver[P]opengametools/apps/../src/ogt_vox.h"
                  ,0x4ed,"uint32_t compute_looped_frame_index(uint32_t, uint32_t, uint32_t)");
  }
  return frames_since_first_frame_1;
}

Assistant:

uint32_t compute_looped_frame_index(uint32_t first_loop_frame, uint32_t last_loop_frame, uint32_t frame_index)
    {
        uint32_t loop_len = 1 + last_loop_frame - first_loop_frame;
        uint32_t looped_frame_index;
        if (frame_index >= first_loop_frame) {
            uint32_t frames_since_first_frame = frame_index - first_loop_frame;
            looped_frame_index = first_loop_frame + (frames_since_first_frame % loop_len);
        }
        else {
            uint32_t frames_since_first_frame = (first_loop_frame - frame_index - 1);
            looped_frame_index = last_loop_frame - (frames_since_first_frame % loop_len);
        }
        ogt_assert(looped_frame_index >= first_loop_frame && looped_frame_index <= last_loop_frame, "bug in looping logic!");
        return looped_frame_index;
    }